

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_thread.cpp
# Opt level: O3

PAL_ERROR CorUnix::InternalGetThreadDataFromHandle
                    (CPalThread *pThread,HANDLE hThread,DWORD dwRightsRequired,
                    CPalThread **ppTargetThread,IPalObject **ppobjThread)

{
  PAL_ERROR PVar1;
  PAL_ERROR PVar2;
  undefined8 *local_48;
  IDataLock *pLock;
  CThreadProcessLocalData *pData;
  IPalObject *pobj;
  
  *ppobjThread = (IPalObject *)0x0;
  if ((undefined1 *)hThread == &DAT_ffffff03) {
    *ppTargetThread = pThread;
    PVar1 = 0;
  }
  else {
    PVar1 = (**(code **)(*g_pObjectManager + 0x28))
                      (g_pObjectManager,pThread,hThread,&aotThread,dwRightsRequired,&pData);
    if (PVar1 == 0) {
      PVar1 = 0;
      PVar2 = (*(code *)(pData->pThread->m_csLock).DebugInfo)(pData,pThread,0,&local_48,&pLock);
      if (PVar2 == 0) {
        *ppTargetThread = (CPalThread *)pLock->_vptr_IDataLock;
        (**(code **)*local_48)(local_48,pThread,0);
        *ppobjThread = (IPalObject *)pData;
      }
      else {
        (**(code **)&(pData->pThread->m_csLock).bInternal)(pData,pThread);
        PVar1 = PVar2;
      }
    }
  }
  return PVar1;
}

Assistant:

PAL_ERROR
CorUnix::InternalGetThreadDataFromHandle(
    CPalThread *pThread,
    HANDLE hThread,
    DWORD dwRightsRequired,
    CPalThread **ppTargetThread,
    IPalObject **ppobjThread
    )
{
    PAL_ERROR palError = NO_ERROR;
    IPalObject *pobj;
    IDataLock *pLock;
    CThreadProcessLocalData *pData;

    *ppobjThread = NULL;

    if (hPseudoCurrentThread == hThread)
    {
        *ppTargetThread = pThread;
    }
    else
    {
        palError = g_pObjectManager->ReferenceObjectByHandle(
            pThread,
            hThread,
            &aotThread,
            dwRightsRequired,
            &pobj
            );

        if (NO_ERROR == palError)
        {
            palError = pobj->GetProcessLocalData(
                pThread,
                ReadLock,
                &pLock,
                reinterpret_cast<void**>(&pData)
                );

            if (NO_ERROR == palError)
            {
                *ppTargetThread = pData->pThread;
                pLock->ReleaseLock(pThread, FALSE);

                //
                // Transfer object reference to out param
                //

                *ppobjThread = pobj;
            }
            else
            {
                pobj->ReleaseReference(pThread);
            }
        }
    }

    return palError;
}